

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  size_type sVar1;
  cmCTest *pcVar2;
  cmMakefile *pcVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  cmValue cVar9;
  cmCTestGenericHandler *pcVar10;
  cmake *gname;
  ostream *poVar11;
  string *psVar12;
  char *pcVar13;
  char *pcVar14;
  string *option;
  pointer pbVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string cmakeConfigureCommand;
  string cmakelists_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  ostringstream e;
  string local_298;
  undefined1 local_278 [8];
  string local_270;
  uint local_23c;
  string local_238;
  string local_218;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined8 local_1b8;
  _Alloc_hider local_1b0;
  ios_base local_168 [264];
  pointer local_60;
  char *pcStack_58;
  char local_50 [32];
  
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = (pointer)0x0;
  local_1f8._16_8_ = (pointer)0x0;
  sVar1 = (this->Options)._M_string_length;
  if (sVar1 != 0) {
    arg._M_str = (this->Options)._M_dataplus._M_p;
    arg._M_len = sVar1;
    cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f8,false);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_278 + 8),"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)local_1d8,pcVar2,(string *)(local_278 + 8));
  uVar5 = local_1d8._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                             local_270.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._0_8_ = &local_1c8;
  if ((char *)uVar5 == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_1d8);
LAB_005b535f:
    local_218.field_2._M_allocated_capacity = local_1c8._M_allocated_capacity;
    local_218._M_dataplus._M_p = (pointer)local_1d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
LAB_005b5374:
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"CTEST_CONFIGURE_COMMAND","");
    cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 cVar9.Value,(this->super_cmCTestHandlerCommand).Quiet);
LAB_005b50fd:
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"CTEST_LABELS_FOR_SUBPROJECTS","");
      cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      if (cVar9.Value != (string *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",cVar9.Value,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar10 = &cmCTest::GetConfigureHandler
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                 super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar10->_vptr_cmCTestGenericHandler)->
        _vptr_cmCTestGenericHandler[3])(pcVar10);
      pcVar10->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_005b537f;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CTEST_CMAKE_GENERATOR","");
    cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if ((cVar9.Value == (string *)0x0) || ((cVar9.Value)->_M_string_length == 0)) {
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1d8);
      goto LAB_005b535f;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1d8._0_8_ = &local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"SourceDirectory","");
    cmCTest::GetCTestConfiguration(&local_218,pcVar2,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (local_218._M_string_length == 0) {
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_005b5374;
    }
    else {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_218._M_dataplus._M_p,
                 local_218._M_dataplus._M_p + local_218._M_string_length);
      std::__cxx11::string::append((char *)&local_238);
      bVar6 = cmsys::SystemTools::FileExists(&local_238);
      if (bVar6) {
        gname = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
        cmake::CreateGlobalGenerator((cmake *)local_278,(string *)gname,SUB81(cVar9.Value,0));
        if (local_278 == (undefined1  [8])0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                               *)local_278)->
                            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl
                            [0x26]._vptr_cmGlobalGeneratorFactory)();
          auVar4 = local_278;
          local_278 = (undefined1  [8])0x0;
          if (auVar4 != (undefined1  [8])0x0) {
            (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)auVar4)->
                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                      _vptr_cmGlobalGeneratorFactory)();
          }
        }
        pcStack_58 = local_50;
        local_60 = (pointer)0x1;
        local_50[0] = '\"';
        psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_1c8._8_8_ = (psVar12->_M_dataplus)._M_p;
        local_1c8._M_allocated_capacity = psVar12->_M_string_length;
        local_1d8._0_8_ = local_60;
        local_1d8._8_8_ = pcStack_58;
        local_270._M_dataplus._M_p = (pointer)0x1;
        local_270._M_string_length = (size_type)&local_270.field_2;
        local_270.field_2._M_local_buf[0] = '\"';
        local_1b8 = 1;
        views._M_len = 3;
        views._M_array = (iterator)local_1d8;
        local_1b0._M_p = (pointer)local_270._M_string_length;
        cmCatViews_abi_cxx11_(&local_298,views);
        uVar5 = local_1f8._8_8_;
        bVar7 = false;
        local_23c = uVar8;
        local_1f8._24_8_ = cVar9;
        if (local_1f8._0_8_ != local_1f8._8_8_) {
          pbVar15 = (pointer)local_1f8._0_8_;
          bVar7 = false;
          do {
            std::__cxx11::string::append((char *)&local_298);
            std::__cxx11::string::_M_append((char *)&local_298,(ulong)(pbVar15->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_298);
            pcVar14 = (pbVar15->_M_dataplus)._M_p;
            pcVar13 = strstr(pcVar14,"CMAKE_BUILD_TYPE=");
            if ((pcVar13 != (char *)0x0) ||
               (pcVar14 = strstr(pcVar14,"CMAKE_BUILD_TYPE:STRING="), pcVar14 != (char *)0x0)) {
              bVar7 = true;
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != (pointer)uVar5);
        }
        uVar5 = local_1f8._24_8_;
        if (((local_23c & 1) == 0 && !bVar7) &&
           (psVar12 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
           psVar12->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_298);
          psVar12 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          std::__cxx11::string::_M_append((char *)&local_298,(ulong)(psVar12->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_298);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1d8._0_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"CTEST_USE_LAUNCHERS","");
        bVar7 = cmMakefile::IsOn(pcVar3,(string *)local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
        }
        if (bVar7) {
          std::__cxx11::string::append((char *)&local_298);
        }
        std::__cxx11::string::append((char *)&local_298);
        std::__cxx11::string::_M_append((char *)&local_298,*(ulong *)uVar5);
        std::__cxx11::string::append((char *)&local_298);
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1d8._0_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"CTEST_CMAKE_GENERATOR_PLATFORM","");
        cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
        }
        if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_298);
          std::__cxx11::string::_M_append
                    ((char *)&local_298,(ulong)((cVar9.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_298);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1d8._0_8_ = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"CTEST_CMAKE_GENERATOR_TOOLSET","");
        cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
        }
        if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
          std::__cxx11::string::append((char *)&local_298);
          std::__cxx11::string::_M_append
                    ((char *)&local_298,(ulong)((cVar9.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_298);
        }
        std::__cxx11::string::append((char *)&local_298);
        std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_218._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_298);
        std::__cxx11::string::append((char *)&local_298);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_278 + 8),"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_1d8,pcVar2,(string *)(local_278 + 8));
        std::__cxx11::string::_M_append((char *)&local_298,local_1d8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append((char *)&local_298);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,&local_298,(this->super_cmCTestHandlerCommand).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (local_278 != (undefined1  [8])0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)local_278)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"CMakeLists.txt file does not exist [",0x24);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,(string *)(local_278 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) goto LAB_005b50fd;
    }
  }
  pcVar10 = (cmCTestGenericHandler *)0x0;
LAB_005b537f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f8);
  return pcVar10;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (!this->Options.empty()) {
    cmExpandList(this->Options, options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}